

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

duckdb_logical_type duckdb_create_list_type(duckdb_logical_type type)

{
  LogicalType *this;
  LogicalType local_30;
  
  if (type == (duckdb_logical_type)0x0) {
    this = (LogicalType *)0x0;
  }
  else {
    this = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this);
    duckdb::LogicalType::LIST(&local_30,(LogicalType *)type);
    duckdb::LogicalType::operator=(this,&local_30);
    duckdb::LogicalType::~LogicalType(&local_30);
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_create_list_type(duckdb_logical_type type) {
	if (!type) {
		return nullptr;
	}
	duckdb::LogicalType *logical_type = new duckdb::LogicalType;
	*logical_type = duckdb::LogicalType::LIST(*reinterpret_cast<duckdb::LogicalType *>(type));
	return reinterpret_cast<duckdb_logical_type>(logical_type);
}